

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
emplace<QTextBrowserPrivate::HistoryEntry_const&>
          (QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *this,qsizetype i,HistoryEntry *args)

{
  HistoryEntry **ppHVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  HistoryEntry tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
           super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
        super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size == i) {
      qVar5 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::freeSpaceAtEnd
                        ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this);
      if (qVar5 == 0) goto LAB_00468bf1;
      QTextBrowserPrivate::HistoryEntry::HistoryEntry
                ((this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                 super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr +
                 (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                 super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size,args);
LAB_00468cee:
      pqVar2 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00468cad;
    }
LAB_00468bf1:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::freeSpaceAtBegin
                        ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this);
      if (qVar5 != 0) {
        QTextBrowserPrivate::HistoryEntry::HistoryEntry
                  ((this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                   super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr + -1,args);
        ppHVar1 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                   super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
        *ppHVar1 = *ppHVar1 + -1;
        goto LAB_00468cee;
      }
    }
  }
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.title.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.title.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.title.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBrowserPrivate::HistoryEntry::HistoryEntry(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
          super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size != 0;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::detachAndGrow
            ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this,(uint)(i == 0 && bVar6),1,
             (HistoryEntry **)0x0,(QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x0);
  if (i == 0 && bVar6) {
    QTextBrowserPrivate::HistoryEntry::HistoryEntry
              ((this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
               super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr + -1,&tmp);
    ppHVar1 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
               super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
    *ppHVar1 = *ppHVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
              super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this,i,1);
    QTextBrowserPrivate::HistoryEntry::HistoryEntry(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry(&tmp);
LAB_00468cad:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }